

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_write_alotof_bufs_with_offset(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  char *__ptr;
  int in_EDI;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  uv_buf_t uVar9;
  char acStack_4a [2];
  uv_loop_t *puStack_48;
  
  fs_write_alotof_bufs_with_offset(in_EDI);
  fs_write_alotof_bufs_with_offset(in_EDI);
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  puStack_48 = (uv_loop_t *)0x1562a0;
  unlink("test_file");
  puStack_48 = (uv_loop_t *)0x1562a5;
  loop = uv_default_loop();
  puStack_48 = (uv_loop_t *)0x1562b6;
  puVar5 = (uv_loop_t *)malloc(0xd4310);
  if (puVar5 == (uv_loop_t *)0x0) {
LAB_001565fb:
    puVar5 = puVar4;
    puStack_48 = (uv_loop_t *)0x156600;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00156600:
    puStack_48 = (uv_loop_t *)0x156605;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00156605:
    puStack_48 = (uv_loop_t *)0x15660a;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_0015660a:
    puStack_48 = (uv_loop_t *)0x15660f;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_0015660f:
    puStack_48 = (uv_loop_t *)0x156614;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00156614:
    puStack_48 = (uv_loop_t *)0x156619;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_00156619:
    puStack_48 = (uv_loop_t *)0x15661e;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_0015661e:
    puStack_48 = (uv_loop_t *)0x156623;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00156623:
    puStack_48 = (uv_loop_t *)0x156628;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_00156628:
    puStack_48 = (uv_loop_t *)0x15662d;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_0015662d:
    puStack_48 = (uv_loop_t *)0x156632;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00156632:
    puStack_48 = (uv_loop_t *)0x156637;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_00156637:
    puStack_48 = (uv_loop_t *)0x15663c;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_0015663c:
    puStack_48 = (uv_loop_t *)0x156641;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00156641:
    puStack_48 = (uv_loop_t *)0x156646;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    puStack_48 = (uv_loop_t *)0x1562e5;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156600;
    if (open_req1.result._4_4_ < 0) goto LAB_00156605;
    puStack_48 = (uv_loop_t *)0x156307;
    uv_fs_req_cleanup(&open_req1);
    puStack_48 = (uv_loop_t *)0x156318;
    iov = uv_buf_init("0123456789",10);
    puStack_48 = (uv_loop_t *)0x156356;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 != 10) goto LAB_0015660a;
    if (write_req.result != 10) goto LAB_0015660f;
    puStack_48 = (uv_loop_t *)0x156379;
    uv_fs_req_cleanup(&write_req);
    lVar7 = 8;
    do {
      puStack_48 = (uv_loop_t *)0x156393;
      uVar9 = uv_buf_init(test_buf,0xd);
      *(char **)((long)puVar5->handle_queue + lVar7 + -0x18) = uVar9.base;
      *(size_t *)((long)puVar5->handle_queue + lVar7 + -0x10) = uVar9.len;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0xd4318);
    puStack_48 = (uv_loop_t *)0x1563d4;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,(uv_buf_t *)puVar5,
                        0xd431,10,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156614;
    if (write_req.result != 0xac67d) goto LAB_00156619;
    puStack_48 = (uv_loop_t *)0x1563f9;
    uv_fs_req_cleanup(&write_req);
    puStack_48 = (uv_loop_t *)0x156403;
    __ptr = (char *)malloc(0xac67d);
    if (__ptr == (char *)0x0) goto LAB_0015661e;
    lVar7 = 8;
    pcVar8 = __ptr;
    do {
      puStack_48 = (uv_loop_t *)0x156425;
      uVar9 = uv_buf_init(pcVar8,0xd);
      *(char **)((long)puVar5->handle_queue + lVar7 + -0x18) = uVar9.base;
      *(size_t *)((long)puVar5->handle_queue + lVar7 + -0x10) = uVar9.len;
      lVar7 = lVar7 + 0x10;
      pcVar8 = pcVar8 + 0xd;
    } while (lVar7 != 0xd4318);
    puStack_48 = (uv_loop_t *)0x15646a;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)puVar5,
                       0xd431,10,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156623;
    lVar7 = 0xd;
    if (iVar2 != 0xd) {
      lVar7 = 0x3400;
    }
    if (read_req.result != lVar7) goto LAB_00156628;
    pcVar8 = __ptr;
    uVar6 = 0;
    do {
      puStack_48 = (uv_loop_t *)0x1564af;
      iVar3 = strncmp(pcVar8,test_buf,0xd);
      if (iVar3 != 0) {
        puStack_48 = (uv_loop_t *)0x1565fb;
        fs_write_alotof_bufs_with_offset_cold_9();
        puVar4 = puVar5;
        goto LAB_001565fb;
      }
      if (iVar2 == 0xd) break;
      pcVar8 = pcVar8 + 0xd;
      bVar1 = uVar6 < 0x3ff;
      uVar6 = uVar6 + 1;
    } while (bVar1);
    puStack_48 = (uv_loop_t *)0x1564dc;
    uv_fs_req_cleanup(&read_req);
    puStack_48 = (uv_loop_t *)0x1564e4;
    free(__ptr);
    puStack_48 = (uv_loop_t *)0x1564fb;
    iVar2 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,"test_file",(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015662d;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_00156632;
    puStack_48 = (uv_loop_t *)0x15652b;
    uv_fs_req_cleanup(&stat_req);
    puStack_48 = (uv_loop_t *)0x15653c;
    uVar9 = uv_buf_init(buf,0x20);
    puStack_48 = (uv_loop_t *)0x15657e;
    iov = uVar9;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,
                       write_req.result + 10,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00156637;
    if (read_req.result != 0) goto LAB_0015663c;
    puStack_48 = (uv_loop_t *)0x1565a0;
    uv_fs_req_cleanup(&read_req);
    puStack_48 = (uv_loop_t *)0x1565b6;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00156641;
    if (close_req.result == 0) {
      puStack_48 = (uv_loop_t *)0x1565d4;
      uv_fs_req_cleanup(&close_req);
      puStack_48 = (uv_loop_t *)0x1565e0;
      unlink("test_file");
      free(puVar5);
      return extraout_EAX;
    }
  }
  puStack_48 = (uv_loop_t *)run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  puStack_48 = puVar5;
  loop = uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_001567bd;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001567c2;
    uv_fs_req_cleanup(&open_req1);
    uVar9 = uv_buf_init(acStack_4a,2);
    iov = uVar9;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x15) goto LAB_001567c7;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      puVar4 = uv_default_loop();
      iVar2 = uv_loop_close(puVar4);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_001567d1;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_001567bd:
    run_test_fs_read_dir_cold_2();
LAB_001567c2:
    run_test_fs_read_dir_cold_3();
LAB_001567c7:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_001567d1:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return 0;
}

Assistant:

TEST_IMPL(fs_write_alotof_bufs_with_offset) {
  fs_write_alotof_bufs_with_offset(0);
  fs_write_alotof_bufs_with_offset(UV_FS_O_FILEMAP);

  MAKE_VALGRIND_HAPPY();
  return 0;
}